

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

Var __thiscall
Js::TypedArray<unsigned_char,_false,_true>::DirectGetItem
          (TypedArray<unsigned_char,_false,_true> *this,uint32 index)

{
  Var pvVar1;
  uint32 index_local;
  TypedArray<unsigned_char,_false,_true> *this_local;
  
  pvVar1 = BaseTypedDirectGetItem(this,index);
  return pvVar1;
}

Assistant:

inline Var Uint8VirtualArray::DirectGetItem(__in uint32 index)
    {
        return BaseTypedDirectGetItem(index);
    }